

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,Ch *str,SizeType length)

{
  byte *pbVar1;
  Ch *pCVar2;
  byte bVar3;
  char cVar4;
  Ch CVar5;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar6;
  byte *pbVar7;
  byte *pbVar8;
  Ch *pCVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  this_00 = &this->os_->stack_;
  uVar12 = (ulong)(length * 6 + 2);
  pcVar10 = this_00->stackTop_;
  pcVar11 = this_00->stackEnd_;
  if (pcVar11 < pcVar10 + uVar12) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,uVar12);
    this_00 = &this->os_->stack_;
    pcVar10 = this_00->stackTop_;
    pcVar11 = this_00->stackEnd_;
  }
  if (pcVar10 + 1 <= pcVar11) {
    this_00->stackTop_ = pcVar10 + 1;
    *pcVar10 = '\"';
    if (length != 0) {
      uVar12 = 0;
      do {
        bVar3 = str[uVar12];
        cVar4 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar3];
        pGVar6 = this->os_;
        pbVar7 = (byte *)(pGVar6->stack_).stackTop_;
        pbVar8 = (byte *)(pGVar6->stack_).stackEnd_;
        pbVar1 = pbVar7 + 1;
        if (cVar4 == '\0') {
          if (pbVar8 < pbVar1) goto LAB_0047d917;
          (pGVar6->stack_).stackTop_ = (char *)pbVar1;
          *pbVar7 = bVar3;
        }
        else {
          if (pbVar8 < pbVar1) goto LAB_0047d917;
          (pGVar6->stack_).stackTop_ = (char *)pbVar1;
          *pbVar7 = 0x5c;
          pGVar6 = this->os_;
          pcVar11 = (pGVar6->stack_).stackTop_;
          pcVar10 = pcVar11 + 1;
          if ((pGVar6->stack_).stackEnd_ < pcVar10) goto LAB_0047d917;
          (pGVar6->stack_).stackTop_ = pcVar10;
          *pcVar11 = cVar4;
          if (cVar4 == 'u') {
            pGVar6 = this->os_;
            pcVar11 = (pGVar6->stack_).stackTop_;
            pcVar10 = pcVar11 + 1;
            if ((pGVar6->stack_).stackEnd_ < pcVar10) goto LAB_0047d917;
            (pGVar6->stack_).stackTop_ = pcVar10;
            *pcVar11 = '0';
            pGVar6 = this->os_;
            pcVar11 = (pGVar6->stack_).stackTop_;
            pcVar10 = pcVar11 + 1;
            if ((pGVar6->stack_).stackEnd_ < pcVar10) goto LAB_0047d917;
            (pGVar6->stack_).stackTop_ = pcVar10;
            *pcVar11 = '0';
            pGVar6 = this->os_;
            pCVar9 = (pGVar6->stack_).stackTop_;
            pCVar2 = pCVar9 + 1;
            if ((pGVar6->stack_).stackEnd_ < pCVar2) goto LAB_0047d917;
            CVar5 = "0123456789ABCDEF"[bVar3 >> 4];
            (pGVar6->stack_).stackTop_ = pCVar2;
            *pCVar9 = CVar5;
            pGVar6 = this->os_;
            pCVar9 = (pGVar6->stack_).stackTop_;
            pCVar2 = pCVar9 + 1;
            if ((pGVar6->stack_).stackEnd_ < pCVar2) goto LAB_0047d917;
            CVar5 = "0123456789ABCDEF"[bVar3 & 0xf];
            (pGVar6->stack_).stackTop_ = pCVar2;
            *pCVar9 = CVar5;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < length);
    }
    pGVar6 = this->os_;
    pcVar11 = (pGVar6->stack_).stackTop_;
    pcVar10 = pcVar11 + 1;
    if (pcVar10 <= (pGVar6->stack_).stackEnd_) {
      (pGVar6->stack_).stackTop_ = pcVar10;
      *pcVar11 = '\"';
      return true;
    }
  }
LAB_0047d917:
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const typename TargetEncoding::Ch hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        if (TargetEncoding::supportUnicode)
            PutReserve(*os_, 2 + length * 6); // "\uxxxx..."
        else
            PutReserve(*os_, 2 + length * 12);  // "\uxxxx\uyyyy..."

        PutUnsafe(*os_, '\"');
        GenericStringStream<SourceEncoding> is(str);
        while (ScanWriteUnescapedString(is, length)) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && static_cast<unsigned>(c) >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (RAPIDJSON_UNLIKELY(!SourceEncoding::Decode(is, &codepoint)))
                    return false;
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, 'u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    PutUnsafe(*os_, hexDigits[(codepoint >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    PutUnsafe(*os_, hexDigits[(lead >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead      ) & 15]);
                    PutUnsafe(*os_, '\\');
                    PutUnsafe(*os_, 'u');
                    PutUnsafe(*os_, hexDigits[(trail >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || static_cast<unsigned>(c) < 256) && RAPIDJSON_UNLIKELY(escape[static_cast<unsigned char>(c)]))  {
                is.Take();
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, static_cast<typename TargetEncoding::Ch>(escape[static_cast<unsigned char>(c)]));
                if (escape[static_cast<unsigned char>(c)] == 'u') {
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) >> 4]);
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) & 0xF]);
                }
            }
            else if (RAPIDJSON_UNLIKELY(!(writeFlags & kWriteValidateEncodingFlag ? 
                Transcoder<SourceEncoding, TargetEncoding>::Validate(is, *os_) :
                Transcoder<SourceEncoding, TargetEncoding>::TranscodeUnsafe(is, *os_))))
                return false;
        }
        PutUnsafe(*os_, '\"');
        return true;
    }